

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_is_melee_weapon_k(object_kind *kind)

{
  object_kind *kind_local;
  
  return kind->tval - 6U < 4;
}

Assistant:

bool tval_is_melee_weapon_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_SWORD:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_DIGGING:
			return true;
		default:
			return false;
	}
}